

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O0

void __thiscall Spi::flash_64kB_sector_erase(Spi *this,int addr)

{
  uint8_t local_18;
  undefined1 local_17;
  undefined1 local_16;
  undefined1 local_15;
  int local_14;
  uint8_t command [4];
  int addr_local;
  Spi *this_local;
  
  local_14 = addr;
  _command = this;
  if ((this->verbose & 1U) != 0) {
    fprintf(_stdout,"erase 64kB sector at 0x%06X..\n",(ulong)(uint)addr);
  }
  local_18 = 0xd8;
  local_17 = (undefined1)((uint)local_14 >> 0x10);
  local_16 = (undefined1)((uint)local_14 >> 8);
  local_15 = (undefined1)local_14;
  flash_chip_select(this);
  send_spi(this,&local_18,4);
  flash_chip_deselect(this);
  return;
}

Assistant:

void Spi::flash_64kB_sector_erase(int addr) {
	if (verbose)
		fprintf(stdout, "erase 64kB sector at 0x%06X..\n", addr);

	uint8_t command[4] = { FC_BE64, (uint8_t) (addr >> 16),
			(uint8_t) (addr >> 8), (uint8_t) addr };

	flash_chip_select();
	send_spi(command, 4);
	flash_chip_deselect();
}